

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcQueueHelper.h
# Opt level: O2

bool __thiscall
helics::ipc::SharedQueueState::setState(SharedQueueState *this,queue_state_t newState)

{
  bool bVar1;
  scoped_lock<boost::interprocess::interprocess_mutex> lock;
  scoped_lock<boost::interprocess::interprocess_mutex> local_40;
  
  bVar1 = false;
  while (!bVar1) {
    local_40.m_locked = false;
    local_40.mp_mutex = &this->data_lock;
    boost::interprocess::ipcdetail::posix_mutex::lock((posix_mutex *)this);
    local_40.m_locked = true;
    this->state = newState;
    boost::interprocess::scoped_lock<boost::interprocess::interprocess_mutex>::~scoped_lock
              (&local_40);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool setState(queue_state_t newState)
        {
            bool success = false;
            int tries = 0;
            while (!success) {
                try {
                    boost::interprocess::scoped_lock<ipcmutex> lock(data_lock);
                    state = newState;
                    success = true;
                }
                catch (const boost::interprocess::lock_exception&) {
                    std::this_thread::sleep_for(std::chrono::milliseconds(100));
                    ++tries;
                    if (tries > 20) {
                        std::cout << "error in connecting to process lock\n";
                        state = newState;
                        return false;
                    }
                }
            }
            return success;
        }